

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleClientProtocolError
          (HttpServerErrorHandler *this,ProtocolError protocolError,Response *response)

{
  ArrayDisposer **this_00;
  StringPtr value;
  uint uVar1;
  AsyncOutputStream *pAVar2;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *attachments_1;
  undefined8 *in_RDX;
  ArrayPtr<unsigned_char> local_168;
  ArrayPtr<const_unsigned_char> local_158;
  undefined1 local_148 [32];
  char *local_128;
  size_t sStack_120;
  undefined1 local_110 [8];
  Own<kj::AsyncOutputStream,_std::nullptr_t> body;
  String errorMessage;
  size_t local_e0;
  undefined1 local_b8 [8];
  HttpHeaders headers;
  HttpHeaderTable headerTable;
  Response *response_local;
  HttpServerErrorHandler *this_local;
  
  this_00 = &headers.ownedStrings.builder.disposer;
  HttpHeaderTable::HttpHeaderTable((HttpHeaderTable *)this_00);
  HttpHeaders::HttpHeaders((HttpHeaders *)local_b8,(HttpHeaderTable *)this_00);
  StringPtr::StringPtr((StringPtr *)&errorMessage.content.disposer,"text/plain");
  value.content.size_ = local_e0;
  value.content.ptr = (char *)errorMessage.content.disposer;
  HttpHeaders::set((HttpHeaders *)local_b8,(HttpHeaderId)(ZEXT416(0xe) << 0x40),value);
  str<char_const(&)[8],kj::StringPtr&>
            ((String *)&body.ptr,(kj *)"ERROR: ",(char (*) [8])&protocolError.description,
             (StringPtr *)errorMessage.content.disposer);
  uVar1 = protocolError.statusCode;
  local_128 = protocolError.statusMessage.content.ptr;
  sStack_120 = protocolError.statusMessage.content.size_;
  local_148._8_8_ = String::size((String *)&body.ptr);
  Maybe<unsigned_long>::Maybe
            ((Maybe<unsigned_long> *)(local_148 + 0x10),(unsigned_long *)(local_148 + 8));
  (**(code **)*in_RDX)(local_110,in_RDX,uVar1,local_128,sStack_120,local_b8,local_148 + 0x10);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)(local_148 + 0x10));
  pAVar2 = Own<kj::AsyncOutputStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_110);
  local_168 = String::asBytes((String *)&body.ptr);
  local_158 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_168);
  (**pAVar2->_vptr_AsyncOutputStream)(local_148,pAVar2,local_158.ptr,local_158.size_);
  attachments_1 = (Own<kj::AsyncOutputStream,_std::nullptr_t> *)mv<kj::String>((String *)&body.ptr);
  mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_110);
  Promise<void>::attach<kj::String,kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,(String *)local_148,attachments_1);
  Promise<void>::~Promise((Promise<void> *)local_148);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_110);
  String::~String((String *)&body.ptr);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_b8);
  HttpHeaderTable::~HttpHeaderTable((HttpHeaderTable *)&headers.ownedStrings.builder.disposer);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleClientProtocolError(
    HttpHeaders::ProtocolError protocolError, kj::HttpService::Response& response) {
  // Default error handler implementation.

  HttpHeaderTable headerTable {};
  HttpHeaders headers(headerTable);
  headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

  auto errorMessage = kj::str("ERROR: ", protocolError.description);
  auto body = response.send(protocolError.statusCode, protocolError.statusMessage,
                            headers, errorMessage.size());

  return body->write(errorMessage.asBytes()).attach(kj::mv(errorMessage), kj::mv(body));
}